

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset_props.cpp
# Opt level: O3

void __thiscall
icu_63::UnicodeSet::applyPattern
          (UnicodeSet *this,RuleCharacterIterator *chars,SymbolTable *symbols,
          UnicodeString *rebuiltPat,uint32_t options,offset_in_UnicodeSet_to_subr caseClosure,
          int32_t depth,UErrorCode *ec)

{
  uint32_t uVar1;
  UBool UVar2;
  uint uVar3;
  int iVar4;
  UChar32 UVar5;
  undefined4 uVar6;
  UnicodeSet *pUVar7;
  UnicodeString *pUVar8;
  UnicodeString *extraout_RAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined7 uVar9;
  UObject UVar10;
  __off_t extraout_RDX;
  __off_t extraout_RDX_00;
  __off_t extraout_RDX_01;
  __off_t __length;
  short sVar11;
  UnicodeSet *result;
  undefined8 uVar12;
  char cVar13;
  char cVar14;
  UnicodeSet *this_00;
  undefined4 uVar15;
  bool bVar16;
  undefined4 in_stack_0000000c;
  UnicodeString *in_stack_00000018;
  UBool literal;
  UnicodeString patLocal;
  Pos backup;
  UnicodeString buf;
  UBool local_141;
  uint local_140;
  uint local_13c;
  UnicodeSet *local_138;
  undefined1 local_130 [16];
  UnicodeSet *local_120;
  uint32_t local_114;
  BMPSet *local_110;
  SymbolTable *local_108;
  _func_int **local_100;
  UObject local_f8;
  UVector *local_f0;
  undefined1 local_e8 [64];
  undefined1 local_a8 [24];
  UChar32 *local_90;
  BMPSet *local_88;
  UChar *local_80;
  UnicodeString local_70;
  
  if (0 < *(int *)&(in_stack_00000018->super_Replaceable).super_UObject._vptr_UObject) {
    return;
  }
  if (100 < (int)caseClosure) {
    *(undefined4 *)&(in_stack_00000018->super_Replaceable).super_UObject._vptr_UObject = 1;
    return;
  }
  local_f8._vptr_UObject = (_func_int **)CONCAT44(in_stack_0000000c,depth);
  local_100 = (_func_int **)ec;
  local_e8._0_8_ = &PTR__UnicodeString_00249818;
  local_e8._8_2_ = 2;
  local_70.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_00249818;
  local_70.fUnion.fStackFields.fLengthAndFlags = 2;
  local_120 = (UnicodeSet *)0x0;
  result = (UnicodeSet *)chars;
  local_108 = symbols;
  clear(this);
  local_13c = (options & 1) * 4 + 3;
  local_88 = (BMPSet *)&PTR__UnicodeSet_00249660;
  local_90 = (UChar32 *)0x0;
  sVar11 = 0;
  local_140 = 0;
  local_110 = (BMPSet *)0x0;
  cVar13 = '\0';
  local_f0 = (UVector *)0x0;
  local_120 = (UnicodeSet *)0x0;
  local_138 = this;
  local_114 = options;
  local_a8._16_8_ = rebuiltPat;
  do {
    UVar2 = RuleCharacterIterator::atEnd(chars);
    if (UVar2 != '\0') {
LAB_0017ed25:
      *(undefined4 *)&(in_stack_00000018->super_Replaceable).super_UObject._vptr_UObject = 0x10002;
      goto LAB_0017ee8d;
    }
    local_141 = '\0';
    result = (UnicodeSet *)(ulong)local_13c;
    UVar2 = resemblesPropertyPattern(chars,local_13c);
    if (UVar2 != '\0') {
      cVar14 = '\x02';
LAB_0017e534:
      pUVar7 = (UnicodeSet *)0x0;
LAB_0017e537:
      if (cVar13 == '\x01') {
        if (sVar11 != 0) goto LAB_0017ebe0;
        add(local_138,local_140,local_140);
        sVar11 = 0;
        result = (UnicodeSet *)(ulong)local_140;
        _appendToPat((UnicodeString *)local_e8,local_140,'\0');
      }
      else if ((sVar11 == 0x2d) || (sVar11 == 0x26)) {
        local_130._0_2_ = sVar11;
        result = (UnicodeSet *)local_130;
        UnicodeString::doAppend((UnicodeString *)local_e8,(UChar *)result,0,1);
      }
      if ((pUVar7 == (UnicodeSet *)0x0) && (pUVar7 = local_120, local_120 == (UnicodeSet *)0x0)) {
        pUVar7 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)result);
        if (pUVar7 == (UnicodeSet *)0x0) {
          uVar15 = 7;
          local_120 = (UnicodeSet *)0x0;
          goto LAB_0017ebe6;
        }
        UnicodeSet(pUVar7);
        local_120 = pUVar7;
      }
      if (cVar14 == '\x03') {
        result = (UnicodeSet *)local_e8;
        pUVar8 = _toPattern(pUVar7,(UnicodeString *)result,'\0');
      }
      else if (cVar14 == '\x02') {
        RuleCharacterIterator::skipIgnored(chars,local_13c);
        result = (UnicodeSet *)chars;
        applyPropertyPattern(pUVar7,chars,(UnicodeString *)local_e8,(UErrorCode *)in_stack_00000018)
        ;
        pUVar8 = in_stack_00000018;
        if (0 < *(int *)&(in_stack_00000018->super_Replaceable).super_UObject._vptr_UObject)
        goto LAB_0017ee8d;
      }
      else {
        local_130._0_8_ = local_f8._vptr_UObject;
        local_130._8_8_ = local_100;
        result = (UnicodeSet *)chars;
        applyPattern(pUVar7,chars,local_108,(UnicodeString *)local_e8,local_114,
                     (ulong)((int)caseClosure + 1),(int32_t)local_f8._vptr_UObject,
                     (UErrorCode *)local_100);
        pUVar8 = extraout_RAX;
      }
      this_00 = local_138;
      if ((char)local_110 != '\0') {
        cVar13 = '\x02';
        local_f0 = (UVector *)CONCAT71((int7)((ulong)pUVar8 >> 8),1);
        if (sVar11 == 0) {
          addAll(local_138,pUVar7);
          result = pUVar7;
        }
        else if (sVar11 == 0x26) {
          retainAll(local_138,pUVar7);
          result = pUVar7;
        }
        else if (sVar11 == 0x2d) {
          removeAll(local_138,pUVar7);
          result = pUVar7;
        }
LAB_0017e747:
        sVar11 = 0;
        goto LAB_0017e749;
      }
      operator=(local_138,pUVar7);
      bVar16 = false;
      goto LAB_0017edbd;
    }
    RuleCharacterIterator::getPos(chars,(Pos *)local_a8);
    result = (UnicodeSet *)(ulong)local_13c;
    uVar3 = RuleCharacterIterator::next(chars,local_13c,&local_141,(UErrorCode *)in_stack_00000018);
    if (0 < *(int *)&(in_stack_00000018->super_Replaceable).super_UObject._vptr_UObject)
    goto LAB_0017ee8d;
    if ((uVar3 == 0x5b) && (local_141 == '\0')) {
      if ((char)local_110 == '\x01') {
        result = (UnicodeSet *)local_a8;
        RuleCharacterIterator::setPos(chars,(Pos *)result);
        cVar14 = '\x01';
        goto LAB_0017e534;
      }
      local_130._0_2_ = 0x5b;
      UnicodeString::doAppend((UnicodeString *)local_e8,(UChar *)local_130,0,1);
      RuleCharacterIterator::getPos(chars,(Pos *)local_a8);
      result = (UnicodeSet *)(ulong)local_13c;
      UVar5 = RuleCharacterIterator::next
                        (chars,local_13c,&local_141,(UErrorCode *)in_stack_00000018);
      uVar12 = CONCAT44(extraout_var_00,UVar5);
      if (0 < *(int *)&(in_stack_00000018->super_Replaceable).super_UObject._vptr_UObject)
      goto LAB_0017ee8d;
      if ((UVar5 == 0x5e) && (local_141 == '\0')) {
        local_130._0_2_ = 0x5e;
        UnicodeString::doAppend((UnicodeString *)local_e8,(UChar *)local_130,0,1);
        RuleCharacterIterator::getPos(chars,(Pos *)local_a8);
        result = (UnicodeSet *)(ulong)local_13c;
        UVar5 = RuleCharacterIterator::next
                          (chars,local_13c,&local_141,(UErrorCode *)in_stack_00000018);
        uVar12 = CONCAT44(extraout_var_01,UVar5);
        if (0 < *(int *)&(in_stack_00000018->super_Replaceable).super_UObject._vptr_UObject)
        goto LAB_0017ee8d;
        local_90 = (UChar32 *)CONCAT71((int7)((ulong)in_stack_00000018 >> 8),1);
      }
      uVar9 = (undefined7)((ulong)uVar12 >> 8);
      if ((int)uVar12 != 0x2d) {
        local_110 = (BMPSet *)CONCAT71(uVar9,1);
        result = (UnicodeSet *)local_a8;
        RuleCharacterIterator::setPos(chars,(Pos *)result);
        goto LAB_0017e749;
      }
      local_141 = '\x01';
      uVar3 = 0x2d;
      local_110 = (BMPSet *)CONCAT71(uVar9,1);
      goto LAB_0017e8c9;
    }
    __length = extraout_RDX;
    if (local_108 != (SymbolTable *)0x0) {
      result = (UnicodeSet *)(ulong)uVar3;
      iVar4 = (*local_108->_vptr_SymbolTable[3])();
      pUVar7 = (UnicodeSet *)CONCAT44(extraout_var,iVar4);
      __length = extraout_RDX_00;
      if (pUVar7 != (UnicodeSet *)0x0) {
        cVar14 = '\x03';
        if ((BMPSet *)(pUVar7->super_UnicodeFilter).super_UnicodeFunctor.super_UObject._vptr_UObject
            == local_88) goto LAB_0017e537;
        goto LAB_0017ebe0;
      }
    }
    pUVar7 = local_138;
    uVar15 = 0x10002;
    if ((char)local_110 == '\0') goto LAB_0017ebe6;
    if (local_141 != '\0') goto LAB_0017e8c9;
    if (0x2c < (int)uVar3) {
      if ((int)uVar3 < 0x5e) {
        if (uVar3 == 0x2d) {
          if (sVar11 == 0) {
            sVar11 = 0x2d;
            if (cVar13 != '\0') goto LAB_0017e749;
            add(local_138,0x2d,0x2d);
            result = (UnicodeSet *)(ulong)local_13c;
            UVar5 = RuleCharacterIterator::next
                              (chars,local_13c,&local_141,(UErrorCode *)in_stack_00000018);
            if (0 < *(int *)&(in_stack_00000018->super_Replaceable).super_UObject._vptr_UObject)
            goto LAB_0017ee8d;
            if ((UVar5 == 0x5d) && (local_141 == '\0')) {
              UnicodeString::doAppend((UnicodeString *)local_e8,L"-]",0,2);
              local_80 = L"-]";
              break;
            }
          }
        }
        else {
          if (uVar3 != 0x5d) goto LAB_0017e8c9;
          if (cVar13 == '\x01') {
            add(local_138,local_140,local_140);
            result = (UnicodeSet *)(ulong)local_140;
            _appendToPat((UnicodeString *)local_e8,local_140,'\0');
          }
          if (sVar11 != 0x26) {
            if (sVar11 == 0x2d) {
              add(pUVar7,0x2d,0x2d);
              local_130._0_2_ = 0x2d;
              UnicodeString::doAppend((UnicodeString *)local_e8,(UChar *)local_130,0,1);
            }
            local_130._0_2_ = 0x5d;
            UnicodeString::doAppend((UnicodeString *)local_e8,(UChar *)local_130,0,1);
            break;
          }
        }
      }
      else {
        if (uVar3 == 0x7b) {
          if (sVar11 != 0) goto LAB_0017ebe6;
          if (cVar13 == '\x01') {
            add(local_138,local_140,local_140);
            _appendToPat((UnicodeString *)local_e8,local_140,'\0');
            __length = extraout_RDX_01;
          }
          result = (UnicodeSet *)0x0;
          UnicodeString::truncate(&local_70,(char *)0x0,__length);
          while (UVar2 = RuleCharacterIterator::atEnd(chars), UVar2 == '\0') {
            result = (UnicodeSet *)(ulong)local_13c;
            uVar3 = RuleCharacterIterator::next
                              (chars,local_13c,&local_141,(UErrorCode *)in_stack_00000018);
            if (0 < *(int *)&(in_stack_00000018->super_Replaceable).super_UObject._vptr_UObject)
            goto LAB_0017ee8d;
            if ((uVar3 == 0x7d) && (local_141 == '\0')) break;
            result = (UnicodeSet *)(ulong)uVar3;
            UnicodeString::append(&local_70,uVar3);
          }
          uVar6 = local_70.fUnion.fFields.fLength;
          if (-1 < local_70.fUnion.fStackFields.fLengthAndFlags) {
            uVar6 = (int)local_70.fUnion.fStackFields.fLengthAndFlags >> 5;
          }
          if ((UVar2 != '\0') || ((int)uVar6 < 1)) goto LAB_0017ebe6;
          add(local_138,&local_70);
          local_130._0_2_ = L'{';
          UnicodeString::doAppend((UnicodeString *)local_e8,(UChar *)local_130,0,1);
          _appendToPat((UnicodeString *)local_e8,&local_70,'\0');
          local_130._0_2_ = 0x7d;
          result = (UnicodeSet *)local_130;
          UnicodeString::doAppend((UnicodeString *)local_e8,(UChar *)result,0,1);
          cVar13 = '\0';
          goto LAB_0017e747;
        }
        if (uVar3 != 0x5e) goto LAB_0017e8c9;
      }
LAB_0017ebe6:
      *(undefined4 *)&(in_stack_00000018->super_Replaceable).super_UObject._vptr_UObject = uVar15;
      goto LAB_0017ee8d;
    }
    if (uVar3 == 0x24) {
      RuleCharacterIterator::getPos(chars,(Pos *)local_a8);
      result = (UnicodeSet *)(ulong)local_13c;
      UVar5 = RuleCharacterIterator::next
                        (chars,local_13c,&local_141,(UErrorCode *)in_stack_00000018);
      pUVar7 = local_138;
      if (0 < *(int *)&(in_stack_00000018->super_Replaceable).super_UObject._vptr_UObject)
      goto LAB_0017ee8d;
      if ((local_108 != (SymbolTable *)0x0) || (local_141 == '\0' && UVar5 == 0x5d)) {
        if ((local_141 != '\0' || UVar5 != 0x5d) || sVar11 != 0) goto LAB_0017ed25;
        if (cVar13 == '\x01') {
          add(local_138,local_140,local_140);
          _appendToPat((UnicodeString *)local_e8,local_140,'\0');
        }
        add(pUVar7,0xffff);
        local_130._0_2_ = L'$';
        UnicodeString::doAppend((UnicodeString *)local_e8,(UChar *)local_130,0,1);
        local_130._0_2_ = 0x5d;
        pUVar8 = UnicodeString::doAppend((UnicodeString *)local_e8,(UChar *)local_130,0,1);
        local_f0 = (UVector *)CONCAT71((int7)((ulong)pUVar8 >> 8),1);
        break;
      }
      uVar3 = 0x24;
      result = (UnicodeSet *)local_a8;
      RuleCharacterIterator::setPos(chars,(Pos *)result);
LAB_0017e8c9:
      if (cVar13 == '\x02') {
        if (sVar11 != 0) {
LAB_0017ebe0:
          uVar15 = 0x10002;
          goto LAB_0017ebe6;
        }
        sVar11 = 0;
LAB_0017e987:
        cVar13 = '\x01';
        local_140 = uVar3;
      }
      else if (cVar13 == '\x01') {
        if (sVar11 == 0x2d) {
          result = (UnicodeSet *)(ulong)local_140;
          if ((int)local_140 < (int)uVar3) {
            add(local_138,local_140,uVar3);
            _appendToPat((UnicodeString *)local_e8,local_140,'\0');
            local_130._0_2_ = 0x2d;
            UnicodeString::doAppend((UnicodeString *)local_e8,(UChar *)local_130,0,1);
            cVar13 = '\0';
            result = (UnicodeSet *)(ulong)uVar3;
            _appendToPat((UnicodeString *)local_e8,uVar3,'\0');
            goto LAB_0017e747;
          }
          goto LAB_0017ebe0;
        }
        add(local_138,local_140,local_140);
        cVar13 = '\x01';
        result = (UnicodeSet *)(ulong)local_140;
        _appendToPat((UnicodeString *)local_e8,local_140,'\0');
        local_140 = uVar3;
      }
      else if (cVar13 == '\0') goto LAB_0017e987;
    }
    else {
      if (uVar3 != 0x26) goto LAB_0017e8c9;
      if ((cVar13 != '\x02') || (sVar11 != 0)) goto LAB_0017ebe6;
      sVar11 = 0x26;
      cVar13 = '\x02';
    }
LAB_0017e749:
  } while ((char)local_110 != '\x02');
  bVar16 = (char)local_f0 == '\0';
  this_00 = local_138;
LAB_0017edbd:
  pUVar7 = (UnicodeSet *)local_a8._16_8_;
  uVar1 = local_114;
  RuleCharacterIterator::skipIgnored(chars,local_13c);
  UVar10 = local_f8;
  if ((uVar1 & 2) == 0) {
    if ((uVar1 & 4) == 0) goto LAB_0017ee23;
    if (((ulong)local_f8._vptr_UObject & 1) != 0) {
      UVar10._vptr_UObject =
           *(_func_int ***)
            (*(long *)((long)local_100 + (long)this_00) + -1 + (long)local_f8._vptr_UObject);
    }
    uVar12 = 4;
  }
  else {
    if (((ulong)local_f8._vptr_UObject & 1) != 0) {
      UVar10._vptr_UObject =
           *(_func_int ***)
            (*(long *)((long)local_100 + (long)this_00) + -1 + (long)local_f8._vptr_UObject);
    }
    uVar12 = 2;
  }
  (*(code *)UVar10._vptr_UObject)((long)local_100 + (long)this_00,uVar12);
LAB_0017ee23:
  if ((char)local_90 != '\0') {
    complement(this_00);
  }
  if (bVar16) {
    _generatePattern(this_00,(UnicodeString *)pUVar7,'\0');
    result = pUVar7;
  }
  else {
    if (-1 < (short)local_e8._8_2_) {
      local_e8._12_4_ = (int)(short)local_e8._8_2_ >> 5;
    }
    result = (UnicodeSet *)local_e8;
    UnicodeString::doAppend((UnicodeString *)pUVar7,(UnicodeString *)result,0,local_e8._12_4_);
  }
  if (((this_00->fFlags & 1) != 0) &&
     (*(int *)&(in_stack_00000018->super_Replaceable).super_UObject._vptr_UObject < 1)) {
    *(undefined4 *)&(in_stack_00000018->super_Replaceable).super_UObject._vptr_UObject = 7;
  }
LAB_0017ee8d:
  pUVar7 = local_120;
  if (local_120 != (UnicodeSet *)0x0) {
    ~UnicodeSet(local_120);
  }
  UMemory::operator_delete((UMemory *)pUVar7,result);
  UnicodeString::~UnicodeString(&local_70);
  UnicodeString::~UnicodeString((UnicodeString *)local_e8);
  return;
}

Assistant:

void UnicodeSet::applyPattern(RuleCharacterIterator& chars,
                              const SymbolTable* symbols,
                              UnicodeString& rebuiltPat,
                              uint32_t options,
                              UnicodeSet& (UnicodeSet::*caseClosure)(int32_t attribute),
                              int32_t depth,
                              UErrorCode& ec) {
    if (U_FAILURE(ec)) return;
    if (depth > MAX_DEPTH) {
        ec = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }

    // Syntax characters: [ ] ^ - & { }

    // Recognized special forms for chars, sets: c-c s-s s&s

    int32_t opts = RuleCharacterIterator::PARSE_VARIABLES |
                   RuleCharacterIterator::PARSE_ESCAPES;
    if ((options & USET_IGNORE_SPACE) != 0) {
        opts |= RuleCharacterIterator::SKIP_WHITESPACE;
    }

    UnicodeString patLocal, buf;
    UBool usePat = FALSE;
    UnicodeSetPointer scratch;
    RuleCharacterIterator::Pos backup;

    // mode: 0=before [, 1=between [...], 2=after ]
    // lastItem: 0=none, 1=char, 2=set
    int8_t lastItem = 0, mode = 0;
    UChar32 lastChar = 0;
    UChar op = 0;

    UBool invert = FALSE;

    clear();

    while (mode != 2 && !chars.atEnd()) {
        U_ASSERT((lastItem == 0 && op == 0) ||
                 (lastItem == 1 && (op == 0 || op == HYPHEN /*'-'*/)) ||
                 (lastItem == 2 && (op == 0 || op == HYPHEN /*'-'*/ ||
                                    op == INTERSECTION /*'&'*/)));

        UChar32 c = 0;
        UBool literal = FALSE;
        UnicodeSet* nested = 0; // alias - do not delete

        // -------- Check for property pattern

        // setMode: 0=none, 1=unicodeset, 2=propertypat, 3=preparsed
        int8_t setMode = 0;
        if (resemblesPropertyPattern(chars, opts)) {
            setMode = 2;
        }

        // -------- Parse '[' of opening delimiter OR nested set.
        // If there is a nested set, use `setMode' to define how
        // the set should be parsed.  If the '[' is part of the
        // opening delimiter for this pattern, parse special
        // strings "[", "[^", "[-", and "[^-".  Check for stand-in
        // characters representing a nested set in the symbol
        // table.

        else {
            // Prepare to backup if necessary
            chars.getPos(backup);
            c = chars.next(opts, literal, ec);
            if (U_FAILURE(ec)) return;

            if (c == 0x5B /*'['*/ && !literal) {
                if (mode == 1) {
                    chars.setPos(backup); // backup
                    setMode = 1;
                } else {
                    // Handle opening '[' delimiter
                    mode = 1;
                    patLocal.append((UChar) 0x5B /*'['*/);
                    chars.getPos(backup); // prepare to backup
                    c = chars.next(opts, literal, ec); 
                    if (U_FAILURE(ec)) return;
                    if (c == 0x5E /*'^'*/ && !literal) {
                        invert = TRUE;
                        patLocal.append((UChar) 0x5E /*'^'*/);
                        chars.getPos(backup); // prepare to backup
                        c = chars.next(opts, literal, ec);
                        if (U_FAILURE(ec)) return;
                    }
                    // Fall through to handle special leading '-';
                    // otherwise restart loop for nested [], \p{}, etc.
                    if (c == HYPHEN /*'-'*/) {
                        literal = TRUE;
                        // Fall through to handle literal '-' below
                    } else {
                        chars.setPos(backup); // backup
                        continue;
                    }
                }
            } else if (symbols != 0) {
                const UnicodeFunctor *m = symbols->lookupMatcher(c);
                if (m != 0) {
                    const UnicodeSet *ms = dynamic_cast<const UnicodeSet *>(m);
                    if (ms == NULL) {
                        ec = U_MALFORMED_SET;
                        return;
                    }
                    // casting away const, but `nested' won't be modified
                    // (important not to modify stored set)
                    nested = const_cast<UnicodeSet*>(ms);
                    setMode = 3;
                }
            }
        }

        // -------- Handle a nested set.  This either is inline in
        // the pattern or represented by a stand-in that has
        // previously been parsed and was looked up in the symbol
        // table.

        if (setMode != 0) {
            if (lastItem == 1) {
                if (op != 0) {
                    // syntaxError(chars, "Char expected after operator");
                    ec = U_MALFORMED_SET;
                    return;
                }
                add(lastChar, lastChar);
                _appendToPat(patLocal, lastChar, FALSE);
                lastItem = 0;
                op = 0;
            }

            if (op == HYPHEN /*'-'*/ || op == INTERSECTION /*'&'*/) {
                patLocal.append(op);
            }

            if (nested == 0) {
                // lazy allocation
                if (!scratch.allocate()) {
                    ec = U_MEMORY_ALLOCATION_ERROR;
                    return;
                }
                nested = scratch.pointer();
            }
            switch (setMode) {
            case 1:
                nested->applyPattern(chars, symbols, patLocal, options, caseClosure, depth + 1, ec);
                break;
            case 2:
                chars.skipIgnored(opts);
                nested->applyPropertyPattern(chars, patLocal, ec);
                if (U_FAILURE(ec)) return;
                break;
            case 3: // `nested' already parsed
                nested->_toPattern(patLocal, FALSE);
                break;
            }

            usePat = TRUE;

            if (mode == 0) {
                // Entire pattern is a category; leave parse loop
                *this = *nested;
                mode = 2;
                break;
            }

            switch (op) {
            case HYPHEN: /*'-'*/
                removeAll(*nested);
                break;
            case INTERSECTION: /*'&'*/
                retainAll(*nested);
                break;
            case 0:
                addAll(*nested);
                break;
            }

            op = 0;
            lastItem = 2;

            continue;
        }

        if (mode == 0) {
            // syntaxError(chars, "Missing '['");
            ec = U_MALFORMED_SET;
            return;
        }

        // -------- Parse special (syntax) characters.  If the
        // current character is not special, or if it is escaped,
        // then fall through and handle it below.

        if (!literal) {
            switch (c) {
            case 0x5D /*']'*/:
                if (lastItem == 1) {
                    add(lastChar, lastChar);
                    _appendToPat(patLocal, lastChar, FALSE);
                }
                // Treat final trailing '-' as a literal
                if (op == HYPHEN /*'-'*/) {
                    add(op, op);
                    patLocal.append(op);
                } else if (op == INTERSECTION /*'&'*/) {
                    // syntaxError(chars, "Trailing '&'");
                    ec = U_MALFORMED_SET;
                    return;
                }
                patLocal.append((UChar) 0x5D /*']'*/);
                mode = 2;
                continue;
            case HYPHEN /*'-'*/:
                if (op == 0) {
                    if (lastItem != 0) {
                        op = (UChar) c;
                        continue;
                    } else {
                        // Treat final trailing '-' as a literal
                        add(c, c);
                        c = chars.next(opts, literal, ec);
                        if (U_FAILURE(ec)) return;
                        if (c == 0x5D /*']'*/ && !literal) {
                            patLocal.append(HYPHEN_RIGHT_BRACE, 2);
                            mode = 2;
                            continue;
                        }
                    }
                }
                // syntaxError(chars, "'-' not after char or set");
                ec = U_MALFORMED_SET;
                return;
            case INTERSECTION /*'&'*/:
                if (lastItem == 2 && op == 0) {
                    op = (UChar) c;
                    continue;
                }
                // syntaxError(chars, "'&' not after set");
                ec = U_MALFORMED_SET;
                return;
            case 0x5E /*'^'*/:
                // syntaxError(chars, "'^' not after '['");
                ec = U_MALFORMED_SET;
                return;
            case 0x7B /*'{'*/:
                if (op != 0) {
                    // syntaxError(chars, "Missing operand after operator");
                    ec = U_MALFORMED_SET;
                    return;
                }
                if (lastItem == 1) {
                    add(lastChar, lastChar);
                    _appendToPat(patLocal, lastChar, FALSE);
                }
                lastItem = 0;
                buf.truncate(0);
                {
                    UBool ok = FALSE;
                    while (!chars.atEnd()) {
                        c = chars.next(opts, literal, ec);
                        if (U_FAILURE(ec)) return;
                        if (c == 0x7D /*'}'*/ && !literal) {
                            ok = TRUE;
                            break;
                        }
                        buf.append(c);
                    }
                    if (buf.length() < 1 || !ok) {
                        // syntaxError(chars, "Invalid multicharacter string");
                        ec = U_MALFORMED_SET;
                        return;
                    }
                }
                // We have new string. Add it to set and continue;
                // we don't need to drop through to the further
                // processing
                add(buf);
                patLocal.append((UChar) 0x7B /*'{'*/);
                _appendToPat(patLocal, buf, FALSE);
                patLocal.append((UChar) 0x7D /*'}'*/);
                continue;
            case SymbolTable::SYMBOL_REF:
                //         symbols  nosymbols
                // [a-$]   error    error (ambiguous)
                // [a$]    anchor   anchor
                // [a-$x]  var "x"* literal '$'
                // [a-$.]  error    literal '$'
                // *We won't get here in the case of var "x"
                {
                    chars.getPos(backup);
                    c = chars.next(opts, literal, ec);
                    if (U_FAILURE(ec)) return;
                    UBool anchor = (c == 0x5D /*']'*/ && !literal);
                    if (symbols == 0 && !anchor) {
                        c = SymbolTable::SYMBOL_REF;
                        chars.setPos(backup);
                        break; // literal '$'
                    }
                    if (anchor && op == 0) {
                        if (lastItem == 1) {
                            add(lastChar, lastChar);
                            _appendToPat(patLocal, lastChar, FALSE);
                        }
                        add(U_ETHER);
                        usePat = TRUE;
                        patLocal.append((UChar) SymbolTable::SYMBOL_REF);
                        patLocal.append((UChar) 0x5D /*']'*/);
                        mode = 2;
                        continue;
                    }
                    // syntaxError(chars, "Unquoted '$'");
                    ec = U_MALFORMED_SET;
                    return;
                }
            default:
                break;
            }
        }

        // -------- Parse literal characters.  This includes both
        // escaped chars ("\u4E01") and non-syntax characters
        // ("a").

        switch (lastItem) {
        case 0:
            lastItem = 1;
            lastChar = c;
            break;
        case 1:
            if (op == HYPHEN /*'-'*/) {
                if (lastChar >= c) {
                    // Don't allow redundant (a-a) or empty (b-a) ranges;
                    // these are most likely typos.
                    // syntaxError(chars, "Invalid range");
                    ec = U_MALFORMED_SET;
                    return;
                }
                add(lastChar, c);
                _appendToPat(patLocal, lastChar, FALSE);
                patLocal.append(op);
                _appendToPat(patLocal, c, FALSE);
                lastItem = 0;
                op = 0;
            } else {
                add(lastChar, lastChar);
                _appendToPat(patLocal, lastChar, FALSE);
                lastChar = c;
            }
            break;
        case 2:
            if (op != 0) {
                // syntaxError(chars, "Set expected after operator");
                ec = U_MALFORMED_SET;
                return;
            }
            lastChar = c;
            lastItem = 1;
            break;
        }
    }

    if (mode != 2) {
        // syntaxError(chars, "Missing ']'");
        ec = U_MALFORMED_SET;
        return;
    }

    chars.skipIgnored(opts);

    /**
     * Handle global flags (invert, case insensitivity).  If this
     * pattern should be compiled case-insensitive, then we need
     * to close over case BEFORE COMPLEMENTING.  This makes
     * patterns like /[^abc]/i work.
     */
    if ((options & USET_CASE_INSENSITIVE) != 0) {
        (this->*caseClosure)(USET_CASE_INSENSITIVE);
    }
    else if ((options & USET_ADD_CASE_MAPPINGS) != 0) {
        (this->*caseClosure)(USET_ADD_CASE_MAPPINGS);
    }
    if (invert) {
        complement();
    }

    // Use the rebuilt pattern (patLocal) only if necessary.  Prefer the
    // generated pattern.
    if (usePat) {
        rebuiltPat.append(patLocal);
    } else {
        _generatePattern(rebuiltPat, FALSE);
    }
    if (isBogus() && U_SUCCESS(ec)) {
        // We likely ran out of memory. AHHH!
        ec = U_MEMORY_ALLOCATION_ERROR;
    }
}